

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void deleteBasisEntries(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
                       bool *deleted_basic,bool *deleted_nonbasic,
                       HighsIndexCollection *index_collection,HighsInt entry_dim)

{
  value_type vVar1;
  reference pvVar2;
  HighsIndexCollection *in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_RDI;
  int in_R8D;
  HighsInt entry_1;
  HighsInt entry;
  HighsInt k;
  HighsInt new_num_entry;
  HighsInt current_set_entry;
  HighsInt keep_to_entry;
  HighsInt keep_from_entry;
  HighsInt delete_to_entry;
  HighsInt delete_from_entry;
  HighsInt to_k;
  HighsInt from_k;
  int local_50;
  int local_4c;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar6;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar7;
  
  limits(in_RCX,(HighsInt *)&stack0xffffffffffffffd8,(HighsInt *)&stack0xffffffffffffffd4);
  if (in_stack_ffffffffffffffd8 <= in_stack_ffffffffffffffd4) {
    iVar5 = -1;
    uVar4 = 0;
    iVar3 = 0;
    *in_RSI = 0;
    *in_RDX = 0;
    local_4c = in_stack_ffffffffffffffd0;
    iVar7 = in_stack_ffffffffffffffd8;
    for (; iVar6 = local_4c, in_stack_ffffffffffffffd8 <= in_stack_ffffffffffffffd4;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      updateOutInIndex(in_RCX,(HighsInt *)CONCAT44(in_R8D,iVar7),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,local_4c),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (HighsInt *)CONCAT44(iVar5,uVar4),
                       (HighsInt *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
      local_50 = in_stack_ffffffffffffffc8;
      iVar6 = local_4c;
      if (in_stack_ffffffffffffffd8 == iVar7) {
        iVar3 = local_4c;
      }
      for (; local_4c <= in_stack_ffffffffffffffcc; local_4c = local_4c + 1) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (in_RDI,(long)local_4c);
        if (*pvVar2 == kBasic) {
          *in_RSI = 1;
        }
        else {
          *in_RDX = 1;
        }
      }
      in_stack_ffffffffffffffc8 = local_50;
      if (in_R8D + -1 <= in_stack_ffffffffffffffcc) break;
      for (; local_50 <= iVar5; local_50 = local_50 + 1) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (in_RDI,(long)local_50);
        vVar1 = *pvVar2;
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (in_RDI,(long)iVar3);
        *pvVar2 = vVar1;
        iVar3 = iVar3 + 1;
      }
      if (in_R8D + -1 <= iVar5) break;
      local_4c = iVar6;
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,iVar6),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

void deleteBasisEntries(std::vector<HighsBasisStatus>& status,
                        bool& deleted_basic, bool& deleted_nonbasic,
                        const HighsIndexCollection& index_collection,
                        const HighsInt entry_dim) {
  assert(ok(index_collection));
  assert(static_cast<size_t>(entry_dim) == status.size());
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_entry;
  HighsInt delete_to_entry;
  HighsInt keep_from_entry;
  HighsInt keep_to_entry = -1;
  HighsInt current_set_entry = 0;
  HighsInt new_num_entry = 0;
  deleted_basic = false;
  deleted_nonbasic = false;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_entry, delete_to_entry,
                     keep_from_entry, keep_to_entry, current_set_entry);
    // Account for the initial entries being kept
    if (k == from_k) new_num_entry = delete_from_entry;
    // Identify whether a basic or a nonbasic entry has been deleted
    for (HighsInt entry = delete_from_entry; entry <= delete_to_entry;
         entry++) {
      if (status[entry] == HighsBasisStatus::kBasic) {
        deleted_basic = true;
      } else {
        deleted_nonbasic = true;
      }
    }
    if (delete_to_entry >= entry_dim - 1) break;
    for (HighsInt entry = keep_from_entry; entry <= keep_to_entry; entry++) {
      status[new_num_entry] = status[entry];
      new_num_entry++;
    }
    if (keep_to_entry >= entry_dim - 1) break;
  }
  status.resize(new_num_entry);
}